

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenerateTableCreator
          (KotlinGenerator *this,StructDef *struct_def,CodeWriter *writer,IDLOptions *options)

{
  IdlNamer *this_00;
  ostream *poVar1;
  FieldDef *pFVar2;
  IDLOptions *pIVar3;
  CodeWriter *writer_00;
  byte bVar4;
  ostream *poVar5;
  int iVar6;
  pointer ppFVar7;
  BaseType *type;
  char *pcVar8;
  uint uVar9;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> fields_vec;
  string name;
  stringstream params;
  allocator<char> local_291;
  string local_290;
  StructDef *local_270;
  KotlinGenerator *local_268;
  IDLOptions *local_260;
  CodeWriter *local_258;
  _Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> local_250;
  function<void_()> local_238;
  string local_218;
  string local_1f8;
  anon_class_32_4_164dc76f local_1d8;
  undefined1 local_1b8 [392];
  
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::vector
            ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)&local_250
             ,&(struct_def->fields).vec);
  bVar4 = 1;
  iVar6 = 0;
  for (ppFVar7 = local_250._M_impl.super__Vector_impl_data._M_start;
      ppFVar7 != local_250._M_impl.super__Vector_impl_data._M_finish; ppFVar7 = ppFVar7 + 1) {
    pFVar2 = *ppFVar7;
    if (pFVar2->deprecated == false) {
      if ((pFVar2->value).type.base_type == BASE_TYPE_STRUCT) {
        uVar9 = ((pFVar2->value).type.struct_def)->fixed ^ 1;
        iVar6 = iVar6 + uVar9;
        bVar4 = bVar4 & (byte)uVar9;
      }
      else {
        iVar6 = iVar6 + 1;
      }
    }
  }
  if ((bVar4 & (iVar6 < 0x7f && iVar6 != 0)) != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,"create",(allocator<char> *)&local_218);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"",(allocator<char> *)&local_238);
    this_00 = &this->namer_;
    IdlNamer::LegacyJavaMethod2(&local_1f8,this_00,(string *)local_1b8,struct_def,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)local_1b8);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    poVar1 = (ostream *)(local_1b8 + 0x10);
    local_270 = struct_def;
    local_268 = this;
    local_260 = options;
    local_258 = writer;
    std::operator<<(poVar1,"builder: FlatBufferBuilder");
    for (ppFVar7 = local_250._M_impl.super__Vector_impl_data._M_start;
        ppFVar7 != local_250._M_impl.super__Vector_impl_data._M_finish; ppFVar7 = ppFVar7 + 1) {
      pFVar2 = *ppFVar7;
      if (pFVar2->deprecated == false) {
        poVar5 = std::operator<<(poVar1,", ");
        (*(this_00->super_Namer)._vptr_Namer[7])(&local_290,this_00,pFVar2);
        std::operator<<(poVar5,(string *)&local_290);
        std::__cxx11::string::~string((string *)&local_290);
        pcVar8 = ": ";
        if (0xb < (pFVar2->value).type.base_type - BASE_TYPE_UTYPE) {
          pcVar8 = "Offset: ";
        }
        std::operator<<(poVar1,pcVar8);
        pcVar8 = "?";
        if (pFVar2->presence != kOptional) {
          pcVar8 = "";
        }
        if (0xb < (pFVar2->value).type.base_type - BASE_TYPE_UTYPE) {
          pcVar8 = "";
        }
        GenTypeBasic_abi_cxx11_(&local_290,(KotlinGenerator *)&pFVar2->value,type);
        poVar5 = std::operator<<(poVar1,(string *)&local_290);
        std::operator<<(poVar5,pcVar8);
        std::__cxx11::string::~string((string *)&local_290);
      }
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"Int",&local_291);
    writer_00 = local_258;
    pIVar3 = local_260;
    local_1d8.writer = local_258;
    local_1d8.fields_vec =
         (vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)&local_250;
    local_1d8.struct_def = local_270;
    local_1d8.this = local_268;
    std::function<void()>::
    function<flatbuffers::kotlin::KotlinGenerator::GenerateTableCreator(flatbuffers::StructDef&,flatbuffers::CodeWriter&,flatbuffers::IDLOptions)const::_lambda()_1_,void>
              ((function<void()> *)&local_238,&local_1d8);
    GenerateFun(writer_00,&local_1f8,&local_290,&local_218,&local_238,pIVar3->gen_jvmstatic);
    std::_Function_base::~_Function_base(&local_238.super__Function_base);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  std::_Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
  ~_Vector_base(&local_250);
  return;
}

Assistant:

void GenerateTableCreator(StructDef &struct_def, CodeWriter &writer,
                            const IDLOptions options) const {
    // Generate a method that creates a table in one go. This is only possible
    // when the table has no struct fields, since those have to be created
    // inline, and there's no way to do so in Java.
    bool has_no_struct_fields = true;
    int num_fields = 0;
    auto fields_vec = struct_def.fields.vec;

    for (auto it = fields_vec.begin(); it != fields_vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      if (IsStruct(field.value.type)) {
        has_no_struct_fields = false;
      } else {
        num_fields++;
      }
    }
    // JVM specifications restrict default constructor params to be < 255.
    // Longs and doubles take up 2 units, so we set the limit to be < 127.
    if (has_no_struct_fields && num_fields && num_fields < 127) {
      // Generate a table constructor of the form:
      // public static int createName(FlatBufferBuilder builder, args...)

      auto name = namer_.LegacyJavaMethod2("create", struct_def, "");
      std::stringstream params;
      params << "builder: FlatBufferBuilder";
      for (auto it = fields_vec.begin(); it != fields_vec.end(); ++it) {
        auto &field = **it;
        if (field.deprecated) continue;
        params << ", " << namer_.Variable(field);
        if (!IsScalar(field.value.type.base_type)) {
          params << "Offset: ";
        } else {
          params << ": ";
        }
        auto optional = field.IsScalarOptional() ? "?" : "";
        params << GenTypeBasic(field.value.type.base_type) << optional;
      }

      GenerateFun(
          writer, name, params.str(), "Int",
          [&]() {
            writer.SetValue("vec_size", NumToString(fields_vec.size()));

            writer += "builder.startTable({{vec_size}})";

            auto sortbysize = struct_def.sortbysize;
            auto largest = sortbysize ? sizeof(largest_scalar_t) : 1;
            for (size_t size = largest; size; size /= 2) {
              for (auto it = fields_vec.rbegin(); it != fields_vec.rend();
                   ++it) {
                auto &field = **it;
                auto base_type_size = SizeOf(field.value.type.base_type);
                if (!field.deprecated &&
                    (!sortbysize || size == base_type_size)) {
                  writer.SetValue("field_name", namer_.Field(field));

                  // we wrap on null check for scalar optionals
                  writer += field.IsScalarOptional()
                                ? "{{field_name}}?.run { \\"
                                : "\\";

                  writer += namer_.LegacyKotlinMethod("add", field, "") +
                            "(builder, {{field_name}}\\";
                  if (!IsScalar(field.value.type.base_type)) {
                    writer += "Offset\\";
                  }
                  // we wrap on null check for scalar optionals
                  writer += field.IsScalarOptional() ? ") }" : ")";
                }
              }
            }
            writer += "return end{{struct_name}}(builder)";
          },
          options.gen_jvmstatic);
    }
  }